

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O0

void __thiscall QSynth::setMasterVolume(QSynth *this,int masterVolume)

{
  bool bVar1;
  undefined1 local_28 [8];
  QMutexLocker<QMutex> synthLocker;
  int masterVolume_local;
  QSynth *this_local;
  
  synthLocker._12_4_ = masterVolume;
  bVar1 = isRealtime(this);
  if (bVar1) {
    RealtimeHelper::setMasterVolume(this->realtimeHelper,synthLocker._12_4_);
  }
  else {
    QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_28,this->synthMutex);
    bVar1 = isOpen(this);
    if (bVar1) {
      writeMasterVolumeSysex(this->synth,synthLocker._12_4_);
    }
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_28);
  }
  return;
}

Assistant:

void QSynth::setMasterVolume(int masterVolume) {
	if (isRealtime()) {
		realtimeHelper->setMasterVolume(masterVolume);
	} else {
		QMutexLocker synthLocker(synthMutex);
		if (isOpen()) writeMasterVolumeSysex(synth, masterVolume);
	}
}